

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

bool __thiscall cmCTestBZR::UpdateParser::ProcessChunk(UpdateParser *this,char *first,int length)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  
  bVar6 = length == 0;
  if (!bVar6) {
    bVar4 = *first == '\n' || *first == '\r';
    lVar5 = 0;
    do {
      if ((first[lVar5] == '\r') || (first[lVar5] == '\n')) {
        if (!bVar4) {
          poVar3 = (this->super_LineParser).Log;
          if ((poVar3 != (ostream *)0x0) &&
             (__s = (this->super_LineParser).Prefix, __s != (char *)0x0)) {
            sVar2 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,(this->super_LineParser).Line._M_dataplus._M_p,
                                (this->super_LineParser).Line._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          }
          iVar1 = (*(this->super_LineParser).super_OutputParser._vptr_OutputParser[3])(this);
          if ((char)iVar1 == '\0') {
            (this->super_LineParser).Line._M_string_length = 0;
            *(this->super_LineParser).Line._M_dataplus._M_p = '\0';
            return bVar6;
          }
          (this->super_LineParser).Line._M_string_length = 0;
          *(this->super_LineParser).Line._M_dataplus._M_p = '\0';
          bVar4 = true;
        }
      }
      else {
        bVar4 = false;
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&(this->super_LineParser).Line,
                   (this->super_LineParser).Line._M_string_length,0,'\x01');
      }
      lVar5 = lVar5 + 1;
      bVar6 = length == lVar5;
    } while (!bVar6);
  }
  return bVar6;
}

Assistant:

bool ProcessChunk(const char* first, int length) override
  {
    bool last_is_new_line = (*first == '\r' || *first == '\n');

    const char* const last = first + length;
    for (const char* c = first; c != last; ++c) {
      if (*c == '\r' || *c == '\n') {
        if (!last_is_new_line) {
          // Log this line.
          if (this->Log && this->Prefix) {
            *this->Log << this->Prefix << this->Line << "\n";
          }

          // Hand this line to the subclass implementation.
          if (!this->ProcessLine()) {
            this->Line.clear();
            return false;
          }

          this->Line.clear();
          last_is_new_line = true;
        }
      } else {
        // Append this character to the line under construction.
        this->Line.append(1, *c);
        last_is_new_line = false;
      }
    }
    return true;
  }